

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_7::Validator::OnBrExpr(Validator *this,BrExpr *expr)

{
  char *pcVar1;
  int in_EDX;
  BrExpr *expr_local;
  Validator *this_local;
  
  this->expr_loc_ = &(expr->super_ExprMixin<(wabt::ExprType)8>).super_Expr.loc;
  pcVar1 = Var::index(&expr->var,(char *)expr,in_EDX);
  TypeChecker::OnBr(&this->typechecker_,(Index)pcVar1);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnBrExpr(BrExpr* expr) {
  expr_loc_ = &expr->loc;
  typechecker_.OnBr(expr->var.index());
  return Result::Ok;
}